

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

void decorr_stereo_pass(decorr_pass *dpp,int32_t *buffer,int32_t sample_count)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int in_EDX;
  uint *in_RSI;
  short *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  int k;
  int m;
  int32_t sam_B;
  int32_t sam_A;
  int32_t *eptr;
  int32_t *bptr;
  int32_t weight_B;
  int32_t weight_A;
  int32_t delta;
  int32_t temp_samples [8];
  int local_100;
  int local_f0;
  int local_e0;
  int local_d0;
  int local_c0;
  int local_b0;
  int local_a0;
  int local_98;
  int local_90;
  int local_88;
  int local_80;
  int local_78;
  uint local_68;
  uint local_64;
  uint *local_50;
  int local_48;
  int local_44;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (int)in_RDI[1];
  local_44 = (int)in_RDI[2];
  local_48 = (int)in_RDI[3];
  puVar1 = in_RSI + in_EDX * 2;
  local_50 = in_RSI;
  switch(*in_RDI) {
  default:
    local_64 = 0;
    local_68 = (uint)*in_RDI;
    for (; local_68 = local_68 & 7, local_50 < puVar1; local_50 = local_50 + 2) {
      uVar4 = *(uint *)(in_RDI + (long)(int)local_64 * 2 + 4);
      if (uVar4 == (int)(short)uVar4) {
        local_98 = (int)(local_44 * uVar4 + 0x200) >> 10;
      }
      else {
        local_98 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_44 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + (long)(int)local_68 * 2 + 4) = local_98 + *local_50;
      if ((uVar4 != 0) && (*local_50 != 0)) {
        local_44 = ((int)(uVar4 ^ *local_50) >> 0x1e | 1U) * iVar3 + local_44;
      }
      *local_50 = *(uint *)(in_RDI + (long)(int)local_68 * 2 + 4);
      uVar4 = *(uint *)(in_RDI + (long)(int)local_64 * 2 + 0x14);
      if (uVar4 == (int)(short)uVar4) {
        local_a0 = (int)(local_48 * uVar4 + 0x200) >> 10;
      }
      else {
        local_a0 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_48) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_48 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + (long)(int)local_68 * 2 + 0x14) = local_a0 + local_50[1];
      if ((uVar4 != 0) && (local_50[1] != 0)) {
        local_48 = ((int)(uVar4 ^ local_50[1]) >> 0x1e | 1U) * iVar3 + local_48;
      }
      local_50[1] = *(uint *)(in_RDI + (long)(int)local_68 * 2 + 0x14);
      local_64 = local_64 + 1 & 7;
      local_68 = local_68 + 1;
    }
    if (local_64 != 0) {
      local_28 = *(undefined8 *)(in_RDI + 4);
      local_20 = *(undefined8 *)(in_RDI + 8);
      local_18 = *(undefined8 *)(in_RDI + 0xc);
      local_10 = *(undefined8 *)(in_RDI + 0x10);
      for (local_68 = 0; (int)local_68 < 8; local_68 = local_68 + 1) {
        *(undefined4 *)(in_RDI + (long)(int)local_68 * 2 + 4) =
             *(undefined4 *)((long)&local_28 + (long)(int)(local_64 & 7) * 4);
        local_64 = local_64 + 1;
      }
      local_28 = *(undefined8 *)(in_RDI + 0x14);
      local_20 = *(undefined8 *)(in_RDI + 0x18);
      local_18 = *(undefined8 *)(in_RDI + 0x1c);
      local_10 = *(undefined8 *)(in_RDI + 0x20);
      for (local_68 = 0; (int)local_68 < 8; local_68 = local_68 + 1) {
        *(undefined4 *)(in_RDI + (long)(int)local_68 * 2 + 0x14) =
             *(undefined4 *)((long)&local_28 + (long)(int)(local_64 & 7) * 4);
        local_64 = local_64 + 1;
      }
    }
    break;
  case 0x11:
    for (; local_50 < puVar1; local_50 = local_50 + 2) {
      uVar4 = *(int *)(in_RDI + 4) * 2 - *(int *)(in_RDI + 6);
      *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(in_RDI + 4);
      if (uVar4 == (int)(short)uVar4) {
        local_78 = (int)(local_44 * uVar4 + 0x200) >> 10;
      }
      else {
        local_78 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_44 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 4) = local_78 + *local_50;
      if ((uVar4 != 0) && (*local_50 != 0)) {
        local_44 = ((int)(uVar4 ^ *local_50) >> 0x1e | 1U) * iVar3 + local_44;
      }
      *local_50 = *(uint *)(in_RDI + 4);
      uVar4 = *(int *)(in_RDI + 0x14) * 2 - *(int *)(in_RDI + 0x16);
      *(undefined4 *)(in_RDI + 0x16) = *(undefined4 *)(in_RDI + 0x14);
      if (uVar4 == (int)(short)uVar4) {
        local_80 = (int)(local_48 * uVar4 + 0x200) >> 10;
      }
      else {
        local_80 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_48) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_48 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 0x14) = local_80 + local_50[1];
      if ((uVar4 != 0) && (local_50[1] != 0)) {
        local_48 = ((int)(uVar4 ^ local_50[1]) >> 0x1e | 1U) * iVar3 + local_48;
      }
      local_50[1] = *(uint *)(in_RDI + 0x14);
    }
    break;
  case 0x12:
    for (; local_50 < puVar1; local_50 = local_50 + 2) {
      uVar4 = *(int *)(in_RDI + 4) * 3 - *(int *)(in_RDI + 6) >> 1;
      *(undefined4 *)(in_RDI + 6) = *(undefined4 *)(in_RDI + 4);
      if (uVar4 == (int)(short)uVar4) {
        local_88 = (int)(local_44 * uVar4 + 0x200) >> 10;
      }
      else {
        local_88 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_44 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 4) = local_88 + *local_50;
      if ((uVar4 != 0) && (*local_50 != 0)) {
        local_44 = ((int)(uVar4 ^ *local_50) >> 0x1e | 1U) * iVar3 + local_44;
      }
      *local_50 = *(uint *)(in_RDI + 4);
      uVar4 = *(int *)(in_RDI + 0x14) * 3 - *(int *)(in_RDI + 0x16) >> 1;
      *(undefined4 *)(in_RDI + 0x16) = *(undefined4 *)(in_RDI + 0x14);
      if (uVar4 == (int)(short)uVar4) {
        local_90 = (int)(local_48 * uVar4 + 0x200) >> 10;
      }
      else {
        local_90 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_48) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_48 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 0x14) = local_90 + local_50[1];
      if ((uVar4 != 0) && (local_50[1] != 0)) {
        local_48 = ((int)(uVar4 ^ local_50[1]) >> 0x1e | 1U) * iVar3 + local_48;
      }
      local_50[1] = *(uint *)(in_RDI + 0x14);
    }
    break;
  case -0xffff0003:
    for (; local_50 < puVar1; local_50 = local_50 + 2) {
      uVar4 = *local_50;
      if (*(int *)(in_RDI + 4) == (int)(short)*(undefined4 *)(in_RDI + 4)) {
        local_f0 = local_44 * *(int *)(in_RDI + 4) + 0x200 >> 10;
      }
      else {
        local_f0 = (int)(((long)(((long)*(int *)(in_RDI + 4) & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)*(int *)(in_RDI + 4) & 0xffffffffffff0000U) >> 9) *
                         (long)local_44 + 1 >> 1);
      }
      if ((*(int *)(in_RDI + 4) != 0) && (*local_50 != 0)) {
        if ((int)(*(uint *)(in_RDI + 4) ^ *local_50) < 0) {
          local_44 = local_44 - iVar3;
          if (local_44 < -0x400) {
LAB_0021ff45:
            bVar5 = local_44 < 0;
            local_44 = 0x400;
            if (bVar5) {
              local_44 = -0x400;
            }
          }
        }
        else {
          local_44 = iVar3 + local_44;
          if (0x400 < local_44) goto LAB_0021ff45;
        }
      }
      uVar2 = local_50[1];
      if (*(int *)(in_RDI + 0x14) == (int)(short)*(undefined4 *)(in_RDI + 0x14)) {
        local_100 = local_48 * *(int *)(in_RDI + 0x14) + 0x200 >> 10;
      }
      else {
        local_100 = (int)(((long)(((long)*(int *)(in_RDI + 0x14) & 0xffffU) * (long)local_48) >> 9)
                          + ((long)((long)*(int *)(in_RDI + 0x14) & 0xffffffffffff0000U) >> 9) *
                            (long)local_48 + 1 >> 1);
      }
      if ((*(int *)(in_RDI + 0x14) != 0) && (local_50[1] != 0)) {
        if ((int)(*(uint *)(in_RDI + 0x14) ^ local_50[1]) < 0) {
          local_48 = local_48 - iVar3;
          if (local_48 < -0x400) {
LAB_00220094:
            bVar5 = local_48 < 0;
            local_48 = 0x400;
            if (bVar5) {
              local_48 = -0x400;
            }
          }
        }
        else {
          local_48 = iVar3 + local_48;
          if (0x400 < local_48) goto LAB_00220094;
        }
      }
      *(uint *)(in_RDI + 0x14) = uVar4 + local_f0;
      *local_50 = uVar4 + local_f0;
      *(uint *)(in_RDI + 4) = uVar2 + local_100;
      local_50[1] = uVar2 + local_100;
    }
    break;
  case -0xffff0002:
    for (; local_50 < puVar1; local_50 = local_50 + 2) {
      if (*(int *)(in_RDI + 0x14) == (int)(short)*(undefined4 *)(in_RDI + 0x14)) {
        local_d0 = local_48 * *(int *)(in_RDI + 0x14) + 0x200 >> 10;
      }
      else {
        local_d0 = (int)(((long)(((long)*(int *)(in_RDI + 0x14) & 0xffffU) * (long)local_48) >> 9) +
                         ((long)((long)*(int *)(in_RDI + 0x14) & 0xffffffffffff0000U) >> 9) *
                         (long)local_48 + 1 >> 1);
      }
      uVar4 = local_50[1] + local_d0;
      if ((*(int *)(in_RDI + 0x14) != 0) && (local_50[1] != 0)) {
        if ((int)(*(uint *)(in_RDI + 0x14) ^ local_50[1]) < 0) {
          local_48 = local_48 - iVar3;
          if (local_48 < -0x400) {
LAB_0021fc5c:
            bVar5 = local_48 < 0;
            local_48 = 0x400;
            if (bVar5) {
              local_48 = -0x400;
            }
          }
        }
        else {
          local_48 = iVar3 + local_48;
          if (0x400 < local_48) goto LAB_0021fc5c;
        }
      }
      local_50[1] = uVar4;
      if (uVar4 == (int)(short)uVar4) {
        local_e0 = (int)(local_44 * uVar4 + 0x200) >> 10;
      }
      else {
        local_e0 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_44 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 0x14) = *local_50 + local_e0;
      if ((uVar4 != 0) && (*local_50 != 0)) {
        if ((int)(uVar4 ^ *local_50) < 0) {
          local_44 = local_44 - iVar3;
          if (local_44 < -0x400) {
LAB_0021fda0:
            bVar5 = local_44 < 0;
            local_44 = 0x400;
            if (bVar5) {
              local_44 = -0x400;
            }
          }
        }
        else {
          local_44 = iVar3 + local_44;
          if (0x400 < local_44) goto LAB_0021fda0;
        }
      }
      *local_50 = *(uint *)(in_RDI + 0x14);
    }
    break;
  case -0xffff0001:
    for (; local_50 < puVar1; local_50 = local_50 + 2) {
      if (*(int *)(in_RDI + 4) == (int)(short)*(undefined4 *)(in_RDI + 4)) {
        local_b0 = local_44 * *(int *)(in_RDI + 4) + 0x200 >> 10;
      }
      else {
        local_b0 = (int)(((long)(((long)*(int *)(in_RDI + 4) & 0xffffU) * (long)local_44) >> 9) +
                         ((long)((long)*(int *)(in_RDI + 4) & 0xffffffffffff0000U) >> 9) *
                         (long)local_44 + 1 >> 1);
      }
      uVar4 = *local_50 + local_b0;
      if ((*(int *)(in_RDI + 4) != 0) && (*local_50 != 0)) {
        if ((int)(*(uint *)(in_RDI + 4) ^ *local_50) < 0) {
          local_44 = local_44 - iVar3;
          if (local_44 < -0x400) {
LAB_0021f96d:
            bVar5 = local_44 < 0;
            local_44 = 0x400;
            if (bVar5) {
              local_44 = -0x400;
            }
          }
        }
        else {
          local_44 = iVar3 + local_44;
          if (0x400 < local_44) goto LAB_0021f96d;
        }
      }
      *local_50 = uVar4;
      if (uVar4 == (int)(short)uVar4) {
        local_c0 = (int)(local_48 * uVar4 + 0x200) >> 10;
      }
      else {
        local_c0 = (int)(((long)(((long)(int)uVar4 & 0xffffU) * (long)local_48) >> 9) +
                         ((long)((long)(int)uVar4 & 0xffffffffffff0000U) >> 9) * (long)local_48 + 1
                        >> 1);
      }
      *(uint *)(in_RDI + 4) = local_50[1] + local_c0;
      if ((uVar4 != 0) && (local_50[1] != 0)) {
        if ((int)(uVar4 ^ local_50[1]) < 0) {
          local_48 = local_48 - iVar3;
          if (local_48 < -0x400) {
LAB_0021fab3:
            bVar5 = local_48 < 0;
            local_48 = 0x400;
            if (bVar5) {
              local_48 = -0x400;
            }
          }
        }
        else {
          local_48 = iVar3 + local_48;
          if (0x400 < local_48) goto LAB_0021fab3;
        }
      }
      local_50[1] = *(uint *)(in_RDI + 4);
    }
  }
  in_RDI[2] = (short)local_44;
  in_RDI[3] = (short)local_48;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void decorr_stereo_pass (struct decorr_pass *dpp, int32_t *buffer, int32_t sample_count)
{
    int32_t delta = dpp->delta, weight_A = dpp->weight_A, weight_B = dpp->weight_B;
    int32_t *bptr, *eptr = buffer + (sample_count * 2), sam_A, sam_B;
    int m, k;

    switch (dpp->term) {

        case 17:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = 2 * dpp->samples_A [0] - dpp->samples_A [1];
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = 2 * dpp->samples_B [0] - dpp->samples_B [1];
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        case 18:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = (3 * dpp->samples_A [0] - dpp->samples_A [1]) >> 1;
                dpp->samples_A [1] = dpp->samples_A [0];
                dpp->samples_A [0] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [0];

                sam_A = (3 * dpp->samples_B [0] - dpp->samples_B [1]) >> 1;
                dpp->samples_B [1] = dpp->samples_B [0];
                dpp->samples_B [0] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [0];
            }

            break;

        default:
            for (m = 0, k = dpp->term & (MAX_TERM - 1), bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = dpp->samples_A [m];
                dpp->samples_A [k] = apply_weight (weight_A, sam_A) + bptr [0];
                update_weight (weight_A, delta, sam_A, bptr [0]);
                bptr [0] = dpp->samples_A [k];

                sam_A = dpp->samples_B [m];
                dpp->samples_B [k] = apply_weight (weight_B, sam_A) + bptr [1];
                update_weight (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_B [k];

                m = (m + 1) & (MAX_TERM - 1);
                k = (k + 1) & (MAX_TERM - 1);
            }

            if (m) {
                int32_t temp_samples [MAX_TERM];

                memcpy (temp_samples, dpp->samples_A, sizeof (dpp->samples_A));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_A [k] = temp_samples [m & (MAX_TERM - 1)];

                memcpy (temp_samples, dpp->samples_B, sizeof (dpp->samples_B));

                for (k = 0; k < MAX_TERM; k++, m++)
                    dpp->samples_B [k] = temp_samples [m & (MAX_TERM - 1)];
            }

            break;

        case -1:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                bptr [0] = sam_A;
                dpp->samples_A [0] = bptr [1] + apply_weight (weight_B, sam_A);
                update_weight_clip (weight_B, delta, sam_A, bptr [1]);
                bptr [1] = dpp->samples_A [0];
            }

            break;

        case -2:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [1] = sam_B;
                dpp->samples_B [0] = bptr [0] + apply_weight (weight_A, sam_B);
                update_weight_clip (weight_A, delta, sam_B, bptr [0]);
                bptr [0] = dpp->samples_B [0];
            }

            break;

        case -3:
            for (bptr = buffer; bptr < eptr; bptr += 2) {
                sam_A = bptr [0] + apply_weight (weight_A, dpp->samples_A [0]);
                update_weight_clip (weight_A, delta, dpp->samples_A [0], bptr [0]);
                sam_B = bptr [1] + apply_weight (weight_B, dpp->samples_B [0]);
                update_weight_clip (weight_B, delta, dpp->samples_B [0], bptr [1]);
                bptr [0] = dpp->samples_B [0] = sam_A;
                bptr [1] = dpp->samples_A [0] = sam_B;
            }

            break;
    }

    dpp->weight_A = weight_A;
    dpp->weight_B = weight_B;
}